

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_SetFormattedValue::Run(void)

{
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  allocator local_1b2;
  allocator local_1b1;
  TemplateDictionaryPeer peer;
  string expected;
  string dump2;
  string dump;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [32];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"test_SetFormattedValue");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&dump,(UnsafeArena *)0x0);
  peer.dict_ = &dict;
  ctemplate::TemplateDictionary::SetFormattedValue(&dict,"%s test %04d","template test",1);
  ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"PRINTF");
  ctemplate::TemplateString::TemplateString((TemplateString *)&expected,"template test test 0001");
  bVar3 = ctemplate::TemplateDictionaryPeer::ValueIs
                    (&peer,(TemplateString *)&dump,(TemplateString *)&expected);
  if (bVar3) {
    dump._M_dataplus._M_p = (pointer)&dump.field_2;
    dump._M_string_length = 0;
    dump.field_2._M_local_buf[0] = '\0';
    ctemplate::TemplateDictionary::DumpToString((string *)&dict,(int)&dump);
    _Var1._M_p = dump._M_dataplus._M_p;
    pcVar4 = strstr(dump._M_dataplus._M_p,"\n   PRINTF: >template test test 0001<\n");
    if (pcVar4 == (char *)0x0) {
      printf("%s: %d: ASSERT FAILED: \'%s\' not in \'%s\'\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
             ,0xd9,"\n   PRINTF: >template test test 0001<\n",_Var1._M_p);
      pcVar4 = strstr(dump._M_dataplus._M_p,"\n   PRINTF: >template test test 0001<\n");
      if (pcVar4 == (char *)0x0) {
        __assert_fail("strstr((dump.c_str()), (\"\\n   PRINTF: >template test test 0001<\\n\"))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                      ,0xd9,
                      "static void (anonymous namespace)::Test_TemplateDictionary_SetFormattedValue::Run()"
                     );
      }
      goto LAB_00109e35;
    }
    ctemplate::TemplateDictionary::SetFormattedValue(&dict,"%s test %04444d","template test",2);
    std::__cxx11::string::string((string *)&expected,"template test test ",(allocator *)&dump2);
    iVar5 = 0x115b;
    while (bVar3 = iVar5 != 0, iVar5 = iVar5 + -1, bVar3) {
      std::__cxx11::string::append((char *)&expected);
    }
    std::__cxx11::string::append((char *)&expected);
    ctemplate::TemplateString::TemplateString((TemplateString *)&dump2,"PRINTF");
    local_a8._0_8_ = expected._M_dataplus._M_p;
    local_a8._8_8_ = expected._M_string_length;
    local_a8[0x10] = false;
    local_a8._24_8_ = 0;
    bVar3 = ctemplate::TemplateDictionaryPeer::ValueIs
                      (&peer,(TemplateString *)&dump2,(TemplateString *)local_a8);
    if (bVar3) {
      dump2._M_dataplus._M_p = (pointer)&dump2.field_2;
      dump2._M_string_length = 0;
      dump2.field_2._M_local_buf[0] = '\0';
      ctemplate::TemplateDictionary::DumpToString((string *)&dict,(int)&dump2);
      std::__cxx11::string::string((string *)&local_e8,"\n   PRINTF: >",&local_1b1);
      std::operator+(&local_c8,&local_e8,&expected);
      std::__cxx11::string::string((string *)&local_108,"<\n",&local_1b2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     &local_c8,&local_108);
      std::__cxx11::string::operator=((string *)&expected,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      _Var2 = dump2._M_dataplus;
      _Var1 = expected._M_dataplus;
      pcVar4 = strstr(dump2._M_dataplus._M_p,expected._M_dataplus._M_p);
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::~string((string *)&dump2);
        std::__cxx11::string::~string((string *)&expected);
        std::__cxx11::string::~string((string *)&dump);
        ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
        return;
      }
      printf("%s: %d: ASSERT FAILED: \'%s\' not in \'%s\'\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
             ,0xe6,_Var1._M_p,_Var2._M_p);
      pcVar4 = strstr(dump2._M_dataplus._M_p,expected._M_dataplus._M_p);
      if (pcVar4 == (char *)0x0) {
        __assert_fail("strstr((dump2.c_str()), (expected.c_str()))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                      ,0xe6,
                      "static void (anonymous namespace)::Test_TemplateDictionary_SetFormattedValue::Run()"
                     );
      }
      goto LAB_00109e35;
    }
    pcVar4 = "peer.ValueIs(\"PRINTF\", expected)";
  }
  else {
    pcVar4 = "peer.ValueIs(\"PRINTF\", \"template test test 0001\")";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar4);
LAB_00109e35:
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetFormattedValue) {
  TemplateDictionary dict("test_SetFormattedValue", NULL);
  TemplateDictionaryPeer peer(&dict);

  dict.SetFormattedValue(TemplateString("PRINTF", sizeof("PRINTF")-1),
                         "%s test %04d", "template test", 1);

  EXPECT_TRUE(peer.ValueIs("PRINTF", "template test test 0001"));
  string dump;
  dict.DumpToString(&dump);
  ASSERT_STRSTR(dump.c_str(), "\n   PRINTF: >template test test 0001<\n");

  // Now test something of size 4k or so, where we can't use scratchbuf
  dict.SetFormattedValue(TemplateString("PRINTF", sizeof("PRINTF")-1),
                         "%s test %04444d", "template test", 2);
  string expected("template test test ");
  for (int i = 0; i < 4443; ++i)
    expected.append("0");
  expected.append("2");
  EXPECT_TRUE(peer.ValueIs("PRINTF", expected));
  string dump2;
  dict.DumpToString(&dump2);
  expected = string("\n   PRINTF: >") + expected + string("<\n");
  ASSERT_STRSTR(dump2.c_str(), expected.c_str());
}